

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_tests.cpp
# Opt level: O3

void __thiscall
iu_AssertionTest_x_iutest_x_Pred2_Test::Body(iu_AssertionTest_x_iutest_x_Pred2_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  AssertionResult iutest_ar;
  int in_stack_fffffffffffffe00;
  allocator<char> local_1f9;
  AssertionResult local_1f8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [392];
  
  iutest::AssertPred2Helper<bool(*)(int,int),int,int>
            (&local_1f8,(iutest *)"IsGreater","3","1",(char *)IsGreater,(_func_bool_int_int *)0x3,1,
             in_stack_fffffffffffffe00);
  bVar2 = local_1f8.m_result;
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp";
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x1f;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  paVar1 = &local_1f8.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    iutest::AssertPred2Helper<bool(*)(int,int),int,int>
              (&local_1f8,(iutest *)"IsGreater","3","1",(char *)IsGreater,(_func_bool_int_int *)0x3,
               1,in_stack_fffffffffffffe00);
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x20;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred2Helper<bool(*)(int,int),int,int>
              (&local_1f8,(iutest *)"IsGreater","3","1",(char *)IsGreater,(_func_bool_int_int *)0x3,
               1,in_stack_fffffffffffffe00);
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x21;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred2Helper<bool(*)(int,int),int,int>
              (&local_1f8,(iutest *)"IsGreater","3","1",(char *)IsGreater,(_func_bool_int_int *)0x3,
               1,in_stack_fffffffffffffe00);
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x22;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(AssertionTest, Pred2)
{
    IUTEST_ASSERT_PRED2(IsGreater, 3, 1);
    IUTEST_EXPECT_PRED2(IsGreater, 3, 1);
    IUTEST_INFORM_PRED2(IsGreater, 3, 1);
    IUTEST_ASSUME_PRED2(IsGreater, 3, 1);
}